

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_sync_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::PriceSyncTest_TestEqualsSimilar_Test::TestBody
          (PriceSyncTest_TestEqualsSimilar_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  char *message;
  AssertHelper local_a8;
  Message local_a0 [3];
  PriceSync local_88 [56];
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  ByteBuffer buffer1;
  PriceSyncTest_TestEqualsSimilar_Test *this_local;
  
  PriceSyncTest::createBuffer((PriceSyncTest *)&gtest_ar.message_);
  peVar2 = std::
           __shared_ptr_access<bidfx_public_api::tools::BufferInflator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<bidfx_public_api::tools::BufferInflator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&(this->super_PriceSyncTest).buffer_inflator);
  bidfx_public_api::price::pixie::PriceSync::PriceSync
            (local_88,(ByteBuffer *)&gtest_ar.message_,peVar2);
  testing::internal::EqHelper<false>::
  Compare<bidfx_public_api::price::pixie::PriceSync,bidfx_public_api::price::pixie::PriceSync>
            ((EqHelper<false> *)local_50,"price_sync","PriceSync(buffer1, *buffer_inflator)",
             &(this->super_PriceSyncTest).price_sync,local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_a0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_sync_test.cpp"
               ,0x2a,message);
    testing::internal::AssertHelper::operator=(&local_a8,local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(PriceSyncTest, TestEqualsSimilar)
{
    ByteBuffer buffer1 = createBuffer();
    EXPECT_EQ(price_sync, PriceSync(buffer1, *buffer_inflator));
}